

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  cmCustomCommandLines *pcVar3;
  cmTarget *this_01;
  char *pcVar4;
  allocator local_79;
  cmGeneratorExpression local_78;
  string local_70;
  string local_50;
  
  pcVar3 = cmCustomCommand::GetCommandLines(this->CC);
  this_01 = cmMakefile::FindTargetToUse
                      (this->Makefile,
                       *(string **)
                        &(pcVar3->
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                         super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                         ._M_impl.super__Vector_impl_data._M_start[c].
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,false);
  if ((this_01 == (cmTarget *)0x0) || (this_01->TargetTypeValue != EXECUTABLE)) {
    bVar1 = false;
    bVar2 = false;
  }
  else if (this_01->IsImportedTarget == false) {
    this_00 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_CROSSCOMPILING","");
    bVar2 = cmMakefile::IsOn(this_00,&local_70);
    bVar2 = !bVar2;
    bVar1 = true;
  }
  else {
    bVar2 = true;
    bVar1 = false;
  }
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar4 = cmTarget::GetLocation(this_01,&this->Config);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_50);
  }
  else {
    cmGeneratorExpression::Parse(&local_78,(string *)this->GE);
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_78.Backtrace,this->Makefile,
                        &this->Config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_50);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,&local_79);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  std::string const& argv0 = this->CC.GetCommandLines()[c][0];
  cmTarget* target = this->Makefile->FindTargetToUse(argv0);
  if(target && target->GetType() == cmTarget::EXECUTABLE &&
     (target->IsImported() || !this->Makefile->IsOn("CMAKE_CROSSCOMPILING")))
    {
    return target->GetLocation(this->Config);
    }
  return this->GE->Parse(argv0)->Evaluate(this->Makefile, this->Config);
}